

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-pattern-1.cpp
# Opt level: O0

int main(void)

{
  int local_1c;
  int local_18;
  int j;
  int i;
  int B;
  int A;
  
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < 9; local_1c = local_1c + 1) {
      if (local_18 + local_1c < 9) {
        if (local_1c < local_18) {
          std::ostream::operator<<((ostream *)&std::cout,5 - local_1c);
        }
        else {
          std::ostream::operator<<((ostream *)&std::cout,5 - local_18);
        }
      }
      else if (local_1c < local_18) {
        std::ostream::operator<<((ostream *)&std::cout,local_18 + -3);
      }
      else {
        std::ostream::operator<<((ostream *)&std::cout,local_1c + -3);
      }
      std::operator<<((ostream *)&std::cout,' ');
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main() {
  int A = 5;
  int B = (2 * A) - 1;
  for (int i = 0; i < B; i++) {
    for (int j = 0; j < B; j++) {
      if (i + j < B) {
        if (i <= j) {
          cout << A - i;
        } else {
          cout << A - j;
        }
      } else {
        if (i <= j) {
          cout << j - A + 2;
        } else {
          cout << i - A + 2;
        }
      }

      cout << ' ';
    }
    cout << endl;
  }
}